

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O3

Gia_Man_t * Abc_EnumeratePaths(int nSize)

{
  long lVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iLit1;
  int iVar6;
  Gia_Man_t *p;
  int *__ptr;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  Gia_Man_t *pGVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint local_8c;
  
  p = Gia_ManStart(10000);
  local_8c = nSize + 1;
  __ptr = (int *)calloc((long)(int)local_8c,4);
  iVar15 = nSize * local_8c;
  iVar10 = iVar15 * 2;
  if (0 < iVar10) {
    do {
      pGVar7 = Gia_ManAppendObj(p);
      uVar8 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar8 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p->pObjs;
      if ((pGVar7 < pGVar2) || (pGVar2 + p->nObjs <= pGVar7)) {
LAB_0048eab8:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
      if ((pGVar7 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar7)) goto LAB_0048eab8;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  Gia_ManHashAlloc(p);
  *__ptr = 1;
  if (0 < nSize) {
    uVar8 = (ulong)local_8c;
    lVar12 = 2;
    do {
      iVar10 = Gia_ManHashAnd(p,*(int *)((long)__ptr + lVar12 * 2 + -4),(int)lVar12);
      *(int *)((long)__ptr + lVar12 * 2) = iVar10;
      lVar12 = lVar12 + 2;
    } while (uVar8 * 2 != lVar12);
    if (0 < nSize) {
      iVar10 = (nSize + 2) * nSize * 2;
      iVar3 = nSize * 2;
      uVar11 = 1;
      iVar14 = iVar15 + 1;
      iVar6 = iVar3;
      do {
        iVar10 = iVar10 + 2;
        if (iVar15 + 1 < 0) {
LAB_0048ea99:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        iVar4 = Gia_ManHashAnd(p,*__ptr,(iVar15 + (int)uVar11) * 2);
        *__ptr = iVar4;
        lVar12 = 2;
        iVar13 = iVar14;
        iVar4 = iVar10;
        do {
          if ((int)local_8c < 0) goto LAB_0048ea99;
          iVar5 = Gia_ManHashAnd(p,*(int *)((long)__ptr + lVar12 * 2 + -4),iVar6 + (int)lVar12);
          iVar13 = iVar13 + nSize;
          if (iVar13 < 0) goto LAB_0048ea99;
          lVar1 = lVar12 + 2;
          iLit1 = Gia_ManHashAnd(p,*(int *)((long)__ptr + lVar12 * 2),iVar4);
          iVar5 = Gia_ManHashOr(p,iVar5,iLit1);
          *(int *)((long)__ptr + lVar12 * 2) = iVar5;
          lVar12 = lVar1;
          iVar4 = iVar3 + iVar4;
        } while (uVar8 * 2 != lVar1);
        uVar11 = uVar11 + 1;
        local_8c = local_8c + nSize;
        iVar14 = iVar14 + 1;
        iVar6 = iVar6 + iVar3;
      } while (uVar11 != uVar8);
    }
  }
  Gia_ManAppendCo(p,__ptr[nSize]);
  pGVar9 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  free(__ptr);
  return pGVar9;
}

Assistant:

Gia_Man_t * Abc_EnumeratePaths( int nSize )
{
    Gia_Man_t * pTemp, * pGia = Gia_ManStart( 10000 );
    int * pNodes = ABC_CALLOC( int, nSize+1 );
    int x, y, nVars = 2*nSize*(nSize+1);
    for ( x = 0; x < nVars; x++ )
        Gia_ManAppendCi( pGia );
    Gia_ManHashAlloc( pGia );
    // y = 0; x = 0;
    pNodes[0] = 1;
    // y = 0; x > 0 
    for ( x = 1; x <= nSize; x++ )
        pNodes[x] = Gia_ManHashAnd( pGia, pNodes[x-1], Abc_NodeVarX(nSize, 0, x) );
    // y > 0; x >= 0
    for ( y = 1; y <= nSize; y++ )
    {
        // y > 0; x = 0
        pNodes[0] = Gia_ManHashAnd( pGia, pNodes[0], Abc_NodeVarY(nSize, y, 0) );
        // y > 0; x > 0
        for ( x = 1; x <= nSize; x++ )
        {
            int iHor  = Gia_ManHashAnd( pGia, pNodes[x-1], Abc_NodeVarX(nSize, y, x) );
            int iVer  = Gia_ManHashAnd( pGia, pNodes[x],   Abc_NodeVarY(nSize, y, x) );
            pNodes[x] = Gia_ManHashOr( pGia, iHor, iVer );
        }
    }
    Gia_ManAppendCo( pGia, pNodes[nSize] );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    ABC_FREE( pNodes );
    return pGia;
}